

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

VP8StatusCode CopyParts0Data(WebPIDecoder *idec)

{
  long lVar1;
  uint64_t nmemb;
  int *size;
  uint8_t *start;
  long in_RDI;
  uint8_t *part0_buf;
  MemBuffer *mem;
  size_t part_size;
  VP8BitReader *br;
  VP8Decoder *dec;
  VP8StatusCode local_4;
  
  lVar1 = *(long *)(in_RDI + 0x80);
  nmemb = *(long *)(lVar1 + 0x28) - *(long *)(lVar1 + 0x20);
  size = (int *)(in_RDI + 0x128);
  if (nmemb == 0) {
    local_4 = VP8_STATUS_BITSTREAM_ERROR;
  }
  else {
    if (*size == 1) {
      start = (uint8_t *)WebPSafeMalloc(nmemb,(size_t)size);
      if (start == (uint8_t *)0x0) {
        return VP8_STATUS_OUT_OF_MEMORY;
      }
      memcpy(start,*(void **)(lVar1 + 0x20),nmemb);
      *(uint8_t **)(size + 0xc) = start;
      VP8BitReaderSetBuffer((VP8BitReader *)(lVar1 + 0x10),start,nmemb);
    }
    *(uint64_t *)(size + 2) = nmemb + *(long *)(size + 2);
    local_4 = VP8_STATUS_OK;
  }
  return local_4;
}

Assistant:

static VP8StatusCode CopyParts0Data(WebPIDecoder* const idec) {
  VP8Decoder* const dec = (VP8Decoder*)idec->dec_;
  VP8BitReader* const br = &dec->br_;
  const size_t part_size = br->buf_end_ - br->buf_;
  MemBuffer* const mem = &idec->mem_;
  assert(!idec->is_lossless_);
  assert(mem->part0_buf_ == NULL);
  // the following is a format limitation, no need for runtime check:
  assert(part_size <= mem->part0_size_);
  if (part_size == 0) {   // can't have zero-size partition #0
    return VP8_STATUS_BITSTREAM_ERROR;
  }
  if (mem->mode_ == MEM_MODE_APPEND) {
    // We copy and grab ownership of the partition #0 data.
    uint8_t* const part0_buf = (uint8_t*)WebPSafeMalloc(1ULL, part_size);
    if (part0_buf == NULL) {
      return VP8_STATUS_OUT_OF_MEMORY;
    }
    memcpy(part0_buf, br->buf_, part_size);
    mem->part0_buf_ = part0_buf;
    VP8BitReaderSetBuffer(br, part0_buf, part_size);
  } else {
    // Else: just keep pointers to the partition #0's data in dec_->br_.
  }
  mem->start_ += part_size;
  return VP8_STATUS_OK;
}